

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void hydro_memzero(void *pnt,size_t len)

{
  size_t sVar1;
  uchar *pnt_;
  
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    *(undefined1 *)((long)pnt + sVar1) = 0;
  }
  return;
}

Assistant:

void
hydro_memzero(void *pnt, size_t len)
{
#ifdef HAVE_EXPLICIT_BZERO
    explicit_bzero(pnt, len);
#else
    volatile unsigned char *volatile pnt_ = (volatile unsigned char *volatile) pnt;
    size_t i                              = (size_t) 0U;

    while (i < len) {
        pnt_[i++] = 0U;
    }
#endif
}